

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

void __thiscall
cppqc::StatelessGenerator<std::array<bool,5ul>>::
StatelessGenerator<cppqc::detail::ArrayOfStatelessGenerator<bool,5ul>>
          (StatelessGenerator<std::array<bool,_5UL>_> *this,ArrayOfStatelessGenerator<bool,_5UL> *gm
          )

{
  unique_ptr<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
  *this_00;
  StatelessGenModel<cppqc::detail::ArrayOfStatelessGenerator<bool,_5UL>_> *in_RSI;
  ArrayOfStatelessGenerator<bool,_5UL> *in_RDI;
  ArrayOfStatelessGenerator<bool,_5UL> *in_stack_ffffffffffffffe8;
  
  this_00 = (unique_ptr<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
             *)operator_new(0x10);
  detail::ArrayOfStatelessGenerator<bool,_5UL>::ArrayOfStatelessGenerator
            ((ArrayOfStatelessGenerator<bool,_5UL> *)this_00,in_RDI);
  StatelessGenerator<std::array<bool,_5UL>_>::
  StatelessGenModel<cppqc::detail::ArrayOfStatelessGenerator<bool,_5UL>_>::StatelessGenModel
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<cppqc::detail::StatelessGenConcept<std::array<bool,5ul>>,std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,5ul>>>>
  ::unique_ptr<std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,5ul>>>,void>
            (this_00,(pointer)in_RDI);
  detail::ArrayOfStatelessGenerator<bool,_5UL>::~ArrayOfStatelessGenerator
            ((ArrayOfStatelessGenerator<bool,_5UL> *)0x13890a);
  return;
}

Assistant:

StatelessGenerator(const StatelessGeneratorModel& gm)
      : m_gen{new StatelessGenModel<StatelessGeneratorModel>(gm)} {}